

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac_acpkm.c
# Opt level: O0

CMAC_ACPKM_CTX * CMAC_ACPKM_CTX_new(void)

{
  EVP_CIPHER_CTX *pEVar1;
  CMAC_ACPKM_CTX *ctx;
  CMAC_ACPKM_CTX *local_8;
  
  local_8 = (CMAC_ACPKM_CTX *)
            CRYPTO_zalloc(0x90,
                          "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac_acpkm.c"
                          ,0x3d);
  if (local_8 == (CMAC_ACPKM_CTX *)0x0) {
    local_8 = (CMAC_ACPKM_CTX *)0x0;
  }
  else {
    pEVar1 = EVP_CIPHER_CTX_new();
    local_8->cctx = (EVP_CIPHER_CTX *)pEVar1;
    if (local_8->cctx == (EVP_CIPHER_CTX *)0x0) {
      CRYPTO_free(local_8);
      local_8 = (CMAC_ACPKM_CTX *)0x0;
    }
    else {
      pEVar1 = EVP_CIPHER_CTX_new();
      local_8->actx = (EVP_CIPHER_CTX *)pEVar1;
      if (local_8->actx == (EVP_CIPHER_CTX *)0x0) {
        EVP_CIPHER_CTX_free((EVP_CIPHER_CTX *)local_8->cctx);
        CRYPTO_free(local_8);
        local_8 = (CMAC_ACPKM_CTX *)0x0;
      }
      else {
        local_8->nlast_block = -1;
        local_8->num = 0;
        local_8->section_size = 0x1000;
      }
    }
  }
  return local_8;
}

Assistant:

static CMAC_ACPKM_CTX *CMAC_ACPKM_CTX_new(void)
{
    CMAC_ACPKM_CTX *ctx;
    ctx = OPENSSL_zalloc(sizeof(CMAC_ACPKM_CTX));
    if (!ctx)
        return NULL;
    ctx->cctx = EVP_CIPHER_CTX_new();
    if (ctx->cctx == NULL) {
        OPENSSL_free(ctx);
        return NULL;
    }
    ctx->actx = EVP_CIPHER_CTX_new();
    if (ctx->actx == NULL) {
        EVP_CIPHER_CTX_free(ctx->cctx);
        OPENSSL_free(ctx);
        return NULL;
    }
    ctx->nlast_block = -1;
    ctx->num = 0;
    ctx->section_size = 4096; /* recommended value for Kuznyechik */
    return ctx;
}